

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O0

void __thiscall
utObjImportExport_no_vt_just_vns_Test::TestBody(utObjImportExport_no_vt_just_vns_Test *this)

{
  bool bVar1;
  size_t pLength;
  char *pcVar2;
  AssertHelper local_58;
  Message local_50;
  void *local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  aiScene *local_20;
  aiScene *scene;
  Importer myImporter;
  utObjImportExport_no_vt_just_vns_Test *this_local;
  
  myImporter.pimpl = (ImporterPimpl *)this;
  Assimp::Importer::Importer((Importer *)&scene);
  pcVar2 = TestBody::ObjModel;
  pLength = strlen(TestBody::ObjModel);
  local_20 = Assimp::Importer::ReadFileFromMemory((Importer *)&scene,pcVar2,pLength,0,"");
  local_48 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)local_40,"nullptr","scene",&local_48,&local_20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x1a8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  Assimp::Importer::~Importer((Importer *)&scene);
  return;
}

Assistant:

TEST_F(utObjImportExport, no_vt_just_vns) {
    static const char *ObjModel =
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 10 0 0\n"
		"v 0 10 0\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"f 10/10 11/11 12/12\n";

    Assimp::Importer myImporter;
    const aiScene *scene = myImporter.ReadFileFromMemory(ObjModel, strlen(ObjModel), 0);
    EXPECT_NE(nullptr, scene);
}